

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

Value __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::makeString(Interpreter *this,UString *v)

{
  bool bVar1;
  _Base_ptr p_Var2;
  anon_union_8_3_4e909c26_for_v extraout_RDX;
  anon_union_8_3_4e909c26_for_v extraout_RDX_00;
  anon_union_8_3_4e909c26_for_v aVar3;
  Value VVar4;
  Value v_00;
  HeapEntity *local_28;
  
  VVar4._0_8_ = (HeapEntity *)operator_new(0x30);
  (VVar4._0_8_)->type = STRING;
  (VVar4._0_8_)->_vptr_HeapEntity = (_func_int **)&PTR__HeapString_00232788;
  std::__cxx11::u32string::u32string((u32string *)(VVar4._0_8_ + 1),v);
  local_28 = VVar4._0_8_;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back(&(this->heap).entities,&local_28);
  (VVar4._0_8_)->mark = (this->heap).lastMark;
  (this->heap).numEntities =
       (long)(this->heap).entities.
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->heap).entities.
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  bVar1 = Heap::checkHeap(&this->heap);
  aVar3 = extraout_RDX;
  if (bVar1) {
    Heap::markFrom(&this->heap,VVar4._0_8_);
    Stack::mark(&this->stack,&this->heap);
    v_00._4_4_ = 0;
    v_00.t = (this->scratch).t;
    v_00.v.h = (this->scratch).v.h;
    Heap::markFrom(&this->heap,v_00);
    for (p_Var2 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->cachedImports)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      if (*(HeapEntity **)(*(long *)(p_Var2 + 3) + 0x40) != (HeapEntity *)0x0) {
        Heap::markFrom(&this->heap,*(HeapEntity **)(*(long *)(p_Var2 + 3) + 0x40));
      }
    }
    for (p_Var2 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->sourceVals)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      Heap::markFrom(&this->heap,*(HeapEntity **)(p_Var2 + 2));
    }
    Heap::sweep(&this->heap);
    aVar3 = extraout_RDX_00;
  }
  VVar4.v.h = aVar3.h;
  return VVar4;
}

Assistant:

Value makeString(const UString &v)
    {
        Value r;
        r.t = Value::STRING;
        r.v.h = makeHeap<HeapString>(v);
        return r;
    }